

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void baryonyx::itm::
     init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>
               (bit_array *x_pessimistic,bit_array *x_optimistic,random_engine *rng,
               default_cost_type<float> *c,
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *constraints,double init_random)

{
  allocator<reduced_cost> *this;
  int iVar1;
  index iVar2;
  bool bVar3;
  result_type_conflict2 rVar4;
  int iVar5;
  reference this_00;
  size_type __new_size;
  const_reference pvVar6;
  reference pvVar7;
  iterator iVar8;
  iterator iVar9;
  float fVar10;
  int local_f4;
  int local_f0;
  int i_3;
  int i_4;
  int best_1;
  int sum_1;
  int i_1;
  int i_2;
  int best;
  int sum;
  int local_b0;
  int i;
  int r_size;
  merged_constraint *cst_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *__range2_1;
  bernoulli_distribution dist;
  undefined1 local_78 [8];
  vector<reduced_cost,_std::allocator<reduced_cost>_> R;
  merged_constraint *cst;
  const_iterator __end2;
  const_iterator __begin2;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *__range2;
  int max_length;
  double init_random_local;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *constraints_local;
  default_cost_type<float> *c_local;
  random_engine *rng_local;
  bit_array *x_optimistic_local;
  bit_array *x_pessimistic_local;
  
  __range2._4_4_ = 0;
  __end2 = std::
           vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           ::begin(constraints);
  cst = (merged_constraint *)
        std::
        vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ::end(constraints);
  while (bVar3 = __gnu_cxx::
                 operator==<const_baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
                           (&__end2,(__normal_iterator<const_baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
                                     *)&cst), ((bVar3 ^ 0xffU) & 1) != 0) {
    R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
                  ::operator*(&__end2);
    iVar5 = length<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
                      ((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        *)R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    if (__range2._4_4_ < iVar5) {
      __range2._4_4_ =
           length<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
                     ((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                       *)R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    }
    __gnu_cxx::
    __normal_iterator<const_baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
    ::operator++(&__end2);
  }
  this = (allocator<reduced_cost> *)((long)&dist._M_param._M_p + 7);
  std::allocator<reduced_cost>::allocator(this);
  std::vector<reduced_cost,_std::allocator<reduced_cost>_>::vector
            ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78,(long)__range2._4_4_,
             this);
  std::allocator<reduced_cost>::~allocator
            ((allocator<reduced_cost> *)((long)&dist._M_param._M_p + 7));
  std::bernoulli_distribution::bernoulli_distribution
            ((bernoulli_distribution *)&__range2_1,init_random);
  __end2_1 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::begin(constraints);
  cst_1 = (merged_constraint *)
          std::
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          ::end(constraints);
  do {
    bVar3 = __gnu_cxx::
            operator==<const_baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
                      (&__end2_1,
                       (__normal_iterator<const_baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
                        *)&cst_1);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      std::vector<reduced_cost,_std::allocator<reduced_cost>_>::~vector
                ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78);
      return;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
              ::operator*(&__end2_1);
    rVar4 = std::bernoulli_distribution::operator()((bernoulli_distribution *)&__range2_1,rng);
    if (rVar4) {
      __new_size = std::
                   vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
                   size(&this_00->elements);
      std::vector<reduced_cost,_std::allocator<reduced_cost>_>::resize
                ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78,__new_size);
      iVar5 = length<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
                        (&this_00->elements);
      for (local_b0 = 0; local_b0 != iVar5; local_b0 = local_b0 + 1) {
        pvVar6 = std::
                 vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
                 operator[](&this_00->elements,(long)local_b0);
        fVar10 = default_cost_type<float>::operator[](c,pvVar6->variable_index);
        pvVar7 = std::vector<reduced_cost,_std::allocator<reduced_cost>_>::operator[]
                           ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78,
                            (long)local_b0);
        pvVar7->value = fVar10;
        pvVar6 = std::
                 vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
                 operator[](&this_00->elements,(long)local_b0);
        iVar1 = pvVar6->factor;
        pvVar7 = std::vector<reduced_cost,_std::allocator<reduced_cost>_>::operator[]
                           ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78,
                            (long)local_b0);
        pvVar7->factor = iVar1;
        pvVar6 = std::
                 vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
                 operator[](&this_00->elements,(long)local_b0);
        iVar2 = pvVar6->variable_index;
        pvVar7 = std::vector<reduced_cost,_std::allocator<reduced_cost>_>::operator[]
                           ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78,
                            (long)local_b0);
        pvVar7->id = iVar2;
      }
      iVar8 = std::
              begin<std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>
                        ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78);
      iVar9 = std::
              end<std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>
                        ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78);
      std::
      shuffle<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                ((__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                  )iVar8._M_current,
                 (__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                  )iVar9._M_current,rng);
      iVar8 = std::
              begin<std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>
                        ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78);
      iVar9 = std::
              end<std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>
                        ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78);
      std::
      sort<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>
                (iVar8._M_current,iVar9._M_current);
      bVar3 = bit_array_impl::empty(&x_pessimistic->super_bit_array_impl);
      if (!bVar3) {
        i_2 = 0;
        i_1 = -2;
        for (sum_1 = -1; sum_1 < iVar5; sum_1 = sum_1 + 1) {
          if ((this_00->min <= i_2) && (i_2 <= this_00->max)) {
            i_1 = sum_1;
            break;
          }
          if (sum_1 + 1 < iVar5) {
            pvVar7 = std::vector<reduced_cost,_std::allocator<reduced_cost>_>::operator[]
                               ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78,
                                (long)(sum_1 + 1));
            i_2 = pvVar7->factor + i_2;
          }
        }
        for (best_1 = 0; best_1 <= i_1; best_1 = best_1 + 1) {
          pvVar7 = std::vector<reduced_cost,_std::allocator<reduced_cost>_>::operator[]
                             ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78,
                              (long)best_1);
          bit_array_impl::set(&x_pessimistic->super_bit_array_impl,pvVar7->id);
        }
        for (; best_1 != iVar5; best_1 = best_1 + 1) {
          pvVar7 = std::vector<reduced_cost,_std::allocator<reduced_cost>_>::operator[]
                             ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78,
                              (long)best_1);
          bit_array_impl::unset(&x_pessimistic->super_bit_array_impl,pvVar7->id);
        }
      }
      bVar3 = bit_array_impl::empty(&x_optimistic->super_bit_array_impl);
      if (!bVar3) {
        i_4 = 0;
        i_3 = -2;
        for (local_f0 = -1; local_f0 < iVar5; local_f0 = local_f0 + 1) {
          if ((this_00->min <= i_4) && (i_4 <= this_00->max)) {
            i_3 = local_f0;
          }
          if ((i_3 != -2) && (local_f0 + 1 < iVar5)) {
            pvVar7 = std::vector<reduced_cost,_std::allocator<reduced_cost>_>::operator[]
                               ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78,
                                (long)(local_f0 + 1));
            bVar3 = stop_iterating<baryonyx::itm::maximize_tag,float>(pvVar7->value);
            if (bVar3) break;
          }
          if (local_f0 + 1 < iVar5) {
            pvVar7 = std::vector<reduced_cost,_std::allocator<reduced_cost>_>::operator[]
                               ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78,
                                (long)(local_f0 + 1));
            i_4 = pvVar7->factor + i_4;
          }
        }
        for (local_f4 = 0; local_f4 <= i_3; local_f4 = local_f4 + 1) {
          pvVar7 = std::vector<reduced_cost,_std::allocator<reduced_cost>_>::operator[]
                             ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78,
                              (long)local_f4);
          bit_array_impl::set(&x_optimistic->super_bit_array_impl,pvVar7->id);
        }
        for (; local_f4 != iVar5; local_f4 = local_f4 + 1) {
          pvVar7 = std::vector<reduced_cost,_std::allocator<reduced_cost>_>::operator[]
                             ((vector<reduced_cost,_std::allocator<reduced_cost>_> *)local_78,
                              (long)local_f4);
          bit_array_impl::unset(&x_optimistic->super_bit_array_impl,pvVar7->id);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
    ::operator++(&__end2_1);
  } while( true );
}

Assistant:

void
init_with_pre_solve(bit_array& x_pessimistic,
                    bit_array& x_optimistic,
                    random_engine& rng,
                    const Cost& c,
                    const std::vector<merged_constraint>& constraints,
                    const double init_random) noexcept
{
    int max_length = 0;
    for (const auto& cst : constraints)
        if (length(cst.elements) > max_length)
            max_length = length(cst.elements);

    struct reduced_cost
    {
        float value;
        int factor;
        int id;
    };

    std::vector<reduced_cost> R(max_length);
    std::bernoulli_distribution dist(init_random);

    for (const auto& cst : constraints) {
        if (!dist(rng))
            continue;

        R.resize(cst.elements.size());
        const int r_size = length(cst.elements);

        for (int i = 0; i != r_size; ++i) {
            R[i].value = static_cast<float>(c[cst.elements[i].variable_index]);
            R[i].factor = cst.elements[i].factor;
            R[i].id = cst.elements[i].variable_index;
        }

        std::shuffle(std::begin(R), std::end(R), rng);
        std::sort(
          std::begin(R), std::end(R), [](const auto& lhs, const auto& rhs) {
              return is_better_solution<Mode>(lhs.value, rhs.value);
          });

        if (!x_pessimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max) {
                    best = i;
                    break;
                }

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_pessimistic.set(R[i].id);

            for (; i != r_size; ++i) {
                x_pessimistic.unset(R[i].id);
            }
        }

        if (!x_optimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max)
                    best = i;

                if (best != -2 && i + 1 < r_size &&
                    stop_iterating<Mode>(R[i + 1].value))
                    break;

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_optimistic.set(R[i].id);

            for (; i != r_size; ++i)
                x_optimistic.unset(R[i].id);
        }
    }
}